

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldQueryPdu.cpp
# Opt level: O2

void __thiscall DIS::MinefieldQueryPdu::~MinefieldQueryPdu(MinefieldQueryPdu *this)

{
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldQueryPdu_001b1878;
  std::vector<DIS::Point,_std::allocator<DIS::Point>_>::clear(&this->_requestedPerimeterPoints);
  std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::clear(&this->_sensorTypes);
  std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::~vector(&this->_sensorTypes);
  std::vector<DIS::Point,_std::allocator<DIS::Point>_>::~vector(&this->_requestedPerimeterPoints);
  EntityType::~EntityType(&this->_requestedMineType);
  EntityID::~EntityID(&this->_requestingEntityID);
  EntityID::~EntityID(&this->_minefieldID);
  MinefieldFamilyPdu::~MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  return;
}

Assistant:

MinefieldQueryPdu::~MinefieldQueryPdu()
{
    _requestedPerimeterPoints.clear();
    _sensorTypes.clear();
}